

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O1

void __thiscall
ccs::SearchState::cacheProperty
          (SearchState *this,string *propertyName,Specificity spec,Property *property)

{
  _Base_ptr p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  SearchState *this_01;
  iterator iVar4;
  PropertySetting *__b;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_bool>
  pVar5;
  PropertySetting newSetting;
  Property *local_d0;
  PropertySetting local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
  local_88;
  
  this_00 = &this->properties;
  local_d0 = property;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
          ::find(&this_00->_M_t,propertyName);
  PropertySetting::PropertySetting(&local_c8,spec,local_d0);
  p_Var2 = &(this->properties)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var2) {
    this_01 = (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01 == (SearchState *)0x0) {
      __b = (PropertySetting *)0x0;
    }
    else {
      __b = checkCache(this_01,propertyName);
    }
    if (__b != (PropertySetting *)0x0) {
      if (__b->override == true) {
        if (local_c8.override == false) goto LAB_0014c5e7;
LAB_0014c5de:
        uVar3 = (__b->spec).values;
        if ((local_c8.spec.values < uVar3) ||
           ((local_c8.spec.values == uVar3 && (local_c8.spec.names < (__b->spec).names))))
        goto LAB_0014c5e7;
      }
      else if (local_c8.override == false) goto LAB_0014c5de;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_true>
                (&local_88,propertyName,__b);
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                          *)this_00,&local_88);
      iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
      std::
      _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
      ::~_Rb_tree(&local_88.second.values._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((_Rb_tree_header *)iVar4._M_node == p_Var2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
    ::pair<ccs::PropertySetting_&,_true>(&local_88,propertyName,&local_c8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                *)this_00,&local_88);
    std::
    _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
    ::~_Rb_tree(&local_88.second.values._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
      operator_delete(local_88.first._M_dataplus._M_p,
                      local_88.first.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0014c5e7;
  }
  p_Var1 = iVar4._M_node + 2;
  if (local_c8.override == true) {
    if (*(char *)&iVar4._M_node[2]._M_parent != '\0') goto LAB_0014c556;
LAB_0014c55f:
    *(bool *)&iVar4._M_node[2]._M_parent = local_c8.override;
    *(ulong *)p_Var1 = CONCAT44(local_c8.spec.values,local_c8.spec.names);
    std::
    _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
    ::operator=((_Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
                 *)&iVar4._M_node[2]._M_left,&local_c8.values._M_t);
    goto LAB_0014c5e7;
  }
  if (*(char *)&iVar4._M_node[2]._M_parent == '\0') {
LAB_0014c556:
    if ((*(uint *)&iVar4._M_node[2].field_0x4 < local_c8.spec.values) ||
       ((*(uint *)&iVar4._M_node[2].field_0x4 == local_c8.spec.values &&
        (p_Var1->_M_color < local_c8.spec.names)))) goto LAB_0014c55f;
  }
  if (*(char *)&iVar4._M_node[2]._M_parent == '\x01') {
    if (local_c8.override == false) goto LAB_0014c5e7;
LAB_0014c5b4:
    if ((local_c8.spec.values < *(uint *)&iVar4._M_node[2].field_0x4) ||
       ((local_c8.spec.values == *(uint *)&iVar4._M_node[2].field_0x4 &&
        (local_c8.spec.names < p_Var1->_M_color)))) goto LAB_0014c5e7;
  }
  else if (local_c8.override == false) goto LAB_0014c5b4;
  std::
  _Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
  ::_M_insert_unique<ccs::Property_const*const&>
            ((_Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
              *)&iVar4._M_node[2]._M_left,&local_d0);
LAB_0014c5e7:
  std::
  _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::~_Rb_tree(&local_c8.values._M_t);
  return;
}

Assistant:

void cacheProperty(const std::string &propertyName,
      Specificity spec, const Property *property) {
    auto it = properties.find(propertyName);

    PropertySetting newSetting(spec, property);

    if (it == properties.end()) {
      // we don't have a local setting for this yet.
      auto parentProperty = parent ? parent->checkCache(propertyName) : nullptr;
      if (parentProperty) {
        if (parentProperty->better(newSetting))
          // parent copy found, parent property better, leave local cache empty.
          return;

        // copy parent property into local cache. this is done solely to
        // support conflict detection.
        it = properties.insert(std::make_pair(propertyName, *parentProperty))
            .first;
      }
    }

    if (it == properties.end()) {
      properties.insert(std::make_pair(propertyName, newSetting));
    } else if (newSetting.better(it->second)) {
      // new property better than local cache. replace.
      it->second = newSetting;
    } else if (it->second.better(newSetting)) {
      // ignore
    } else {
      // new property has same specificity/override as existing... append.
      it->second.values.insert(property);
    }
  }